

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  SourceCodeInfo_Location *pSVar1;
  
  this->parser_ = parent->parser_;
  this->source_code_info_ = source_code_info;
  pSVar1 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Add
                     (&source_code_info->location_);
  this->location_ = pSVar1;
  RepeatedField<int>::CopyFrom(&pSVar1->path_,&parent->location_->path_);
  SourceCodeInfo_Location::_internal_add_span
            (this->location_,(this->parser_->input_->current_).line);
  SourceCodeInfo_Location::_internal_add_span
            (this->location_,(this->parser_->input_->current_).column);
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}